

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerMSL::entry_point_args_classic_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,bool append_comma)

{
  entry_point_arg_stage_in_abi_cxx11_(__return_storage_ptr__,this);
  entry_point_args_discrete_descriptors(this,__return_storage_ptr__);
  entry_point_args_builtin(this,__return_storage_ptr__);
  if (append_comma && __return_storage_ptr__->_M_string_length != 0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::entry_point_args_classic(bool append_comma)
{
	string ep_args = entry_point_arg_stage_in();
	entry_point_args_discrete_descriptors(ep_args);
	entry_point_args_builtin(ep_args);

	if (!ep_args.empty() && append_comma)
		ep_args += ", ";

	return ep_args;
}